

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_export_crt(mbedtls_rsa_context *ctx,mbedtls_mpi *DP,mbedtls_mpi *DQ,mbedtls_mpi *QP)

{
  int iVar1;
  uint uVar2;
  mbedtls_mpi *in_RCX;
  mbedtls_mpi *in_RDX;
  long in_RSI;
  int is_priv;
  int ret;
  bool local_31;
  int low;
  int local_4;
  
  low = -0x6e;
  iVar1 = mbedtls_mpi_cmp_int(in_RDX,(mbedtls_mpi_sint)in_RCX);
  local_31 = false;
  if (iVar1 != 0) {
    iVar1 = mbedtls_mpi_cmp_int(in_RDX,(mbedtls_mpi_sint)in_RCX);
    local_31 = false;
    if (iVar1 != 0) {
      iVar1 = mbedtls_mpi_cmp_int(in_RDX,(mbedtls_mpi_sint)in_RCX);
      local_31 = false;
      if (iVar1 != 0) {
        iVar1 = mbedtls_mpi_cmp_int(in_RDX,(mbedtls_mpi_sint)in_RCX);
        local_31 = false;
        if (iVar1 != 0) {
          iVar1 = mbedtls_mpi_cmp_int(in_RDX,(mbedtls_mpi_sint)in_RCX);
          local_31 = iVar1 != 0;
        }
      }
    }
  }
  uVar2 = (uint)local_31;
  if (uVar2 != 0) {
    if ((((in_RSI == 0) ||
         (low = mbedtls_mpi_copy(in_RCX,(mbedtls_mpi *)CONCAT44(low,uVar2)), low == 0)) &&
        ((in_RDX == (mbedtls_mpi *)0x0 ||
         (low = mbedtls_mpi_copy(in_RCX,(mbedtls_mpi *)CONCAT44(low,uVar2)), low == 0)))) &&
       ((in_RCX == (mbedtls_mpi *)0x0 ||
        (low = mbedtls_mpi_copy(in_RCX,(mbedtls_mpi *)CONCAT44(low,uVar2)), low == 0)))) {
      local_4 = 0;
    }
    else {
      local_4 = mbedtls_error_add(-0x4080,low,
                                  "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/third_party/mbedtls/library/rsa.cpp"
                                  ,0x3aa);
    }
    return local_4;
  }
  return -0x4080;
}

Assistant:

int mbedtls_rsa_export_crt(const mbedtls_rsa_context *ctx,
                           mbedtls_mpi *DP, mbedtls_mpi *DQ, mbedtls_mpi *QP)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    int is_priv;

    /* Check if key is private or public */
    is_priv =
        mbedtls_mpi_cmp_int(&ctx->N, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->P, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->Q, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->D, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->E, 0) != 0;

    if (!is_priv) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

#if !defined(MBEDTLS_RSA_NO_CRT)
    /* Export all requested blinding parameters. */
    if ((DP != NULL && (ret = mbedtls_mpi_copy(DP, &ctx->DP)) != 0) ||
        (DQ != NULL && (ret = mbedtls_mpi_copy(DQ, &ctx->DQ)) != 0) ||
        (QP != NULL && (ret = mbedtls_mpi_copy(QP, &ctx->QP)) != 0)) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_BAD_INPUT_DATA, ret);
    }
#else
    if ((ret = mbedtls_rsa_deduce_crt(&ctx->P, &ctx->Q, &ctx->D,
                                      DP, DQ, QP)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_BAD_INPUT_DATA, ret);
    }
#endif

    return 0;
}